

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstr.cpp
# Opt level: O0

void __thiscall NaCSTRFunc::NaCSTRFunc(NaCSTRFunc *this,char *szOptions,NaVector *vInit)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  undefined8 *puVar4;
  char *pcVar5;
  char *pcVar6;
  NaParams *this_00;
  undefined8 uVar7;
  long *in_RDX;
  char *in_RSI;
  NaExternFunc *in_RDI;
  double dVar8;
  char *szOutFile;
  char *szParFile;
  char *szBuffer;
  int i;
  uint local_28;
  
  NaExternFunc::NaExternFunc(in_RDI);
  *(undefined ***)in_RDI = &PTR_PrintLog_00105d30;
  *(undefined8 *)(in_RDI + 0x98) = 0;
  *(undefined8 *)(in_RDI + 0xa0) = 0;
  *(undefined8 *)(in_RDI + 0x70) = 0x3fdf74bc6a7ef9db;
  *(undefined8 *)(in_RDI + 0x78) = 0x4000089a02752546;
  *(undefined8 *)(in_RDI + 0x80) = 0x3ffb96bb98c7e282;
  *(undefined8 *)(in_RDI + 0x88) = 0x4076b9c28f5c28f6;
  *(undefined8 *)(in_RDI + 0x90) = 0x4075e26666666666;
  iVar2 = (**(code **)(*in_RDX + 0x30))();
  if (iVar2 == 5) {
    for (local_28 = 0; uVar3 = (**(code **)(*in_RDX + 0x30))(), local_28 < uVar3;
        local_28 = local_28 + 1) {
      puVar4 = (undefined8 *)(**(code **)(*in_RDX + 0x40))(in_RDX,local_28);
      *(undefined8 *)(in_RDI + (long)(int)local_28 * 8 + 0x70) = *puVar4;
    }
  }
  NaPrintLog("cstr: initial state: c_A=%g, c_B=%g, c_C=%g, T=%g, T_c=%g\n",
             *(undefined8 *)(in_RDI + 0x70),*(undefined8 *)(in_RDI + 0x78),
             *(undefined8 *)(in_RDI + 0x80),*(undefined8 *)(in_RDI + 0x88),
             *(undefined8 *)(in_RDI + 0x90));
  *(undefined8 *)(in_RDI + 0xa8) = 0x3f8eb851eb851eb8;
  *(undefined8 *)(in_RDI + 0xb0) = 0x3fcd70a3d70a3d71;
  *(undefined8 *)(in_RDI + 0xb8) = 0x3fcae147ae147ae1;
  *(undefined8 *)(in_RDI + 0xc0) = 0x408fe00000000000;
  *(undefined8 *)(in_RDI + 200) = 0x408f300000000000;
  *(undefined8 *)(in_RDI + 0xd0) = 0x4010147ae147ae14;
  *(undefined8 *)(in_RDI + 0xd8) = 0x4010ba5e353f7cee;
  *(undefined8 *)(in_RDI + 0xe0) = 0x3ff828f5c28f5c29;
  *(undefined8 *)(in_RDI + 0xe8) = 0x4045666666666666;
  *(undefined8 *)(in_RDI + 0xf0) = 0x42420b5c27000000;
  *(undefined8 *)(in_RDI + 0xf8) = 0x4542d17ff8a0b61e;
  *(undefined8 *)(in_RDI + 0x100) = 0xc0f4ff0000000000;
  *(undefined8 *)(in_RDI + 0x110) = 0x4010e147ae147ae1;
  *(undefined8 *)(in_RDI + 0x118) = 0;
  *(undefined8 *)(in_RDI + 0x120) = 0;
  *(undefined8 *)(in_RDI + 0x128) = 0x4074800000000000;
  *(undefined8 *)(in_RDI + 0x130) = 0x4072a00000000000;
  *(undefined8 *)(in_RDI + 0x138) = 0x3f70624dd2f1a9fc;
  *(undefined8 *)(in_RDI + 0x168) = 0x40c33d0000000000;
  *(undefined8 *)(in_RDI + 0x170) = 0x40d580c000000000;
  pcVar5 = strdup(in_RSI);
  pcVar5 = strtok(pcVar5," ");
  pcVar6 = strtok((char *)0x0," ");
  if (pcVar5 == (char *)0x0) {
    NaPrintLog("cstr: no parameters file is specified; using defaults\n");
  }
  else {
    NaPrintLog("cstr: try to open parameters in file \'%s\'\n",pcVar5);
    this_00 = (NaParams *)operator_new(0x420);
    NaParams::NaParams(this_00,pcVar5,0,(char **)0x0,"#=");
    *(NaParams **)(in_RDI + 0x98) = this_00;
    if (*(long *)(in_RDI + 0x98) != 0) {
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 0xa8),"q");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 0xa8) = dVar8;
      }
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 0xb0),"V");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 0xb0) = dVar8;
      }
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 0xb8),"V_c");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 0xb8) = dVar8;
      }
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 0xc0),"rho");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 0xc0) = dVar8;
      }
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 200),"rho_c");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 200) = dVar8;
      }
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 0xd0),"Cp");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 0xd0) = dVar8;
      }
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 0xd8),"Cp_c");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 0xd8) = dVar8;
      }
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 0xe0),"A");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 0xe0) = dVar8;
      }
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 0xe8),"k");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 0xe8) = dVar8;
      }
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 0xf0),"k10");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 0xf0) = dVar8;
      }
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 0xf8),"k20");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 0xf8) = dVar8;
      }
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 0x100),"drH_1");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 0x100) = dVar8;
      }
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 0x108),"drH_2");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 0x108) = dVar8;
      }
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 0x110),"c_Av");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 0x110) = dVar8;
      }
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 0x118),"c_Bv");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 0x118) = dVar8;
      }
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 0x120),"c_Cv");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 0x120) = dVar8;
      }
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 0x128),"T_v");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 0x128) = dVar8;
      }
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 0x130),"T_vc");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 0x130) = dVar8;
      }
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 0x168),"E1R");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 0x168) = dVar8;
      }
      bVar1 = NaParams::CheckParam(*(char **)(in_RDI + 0x98));
      if ((bVar1 & 1) == 0) {
        NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",
                   *(undefined8 *)(in_RDI + 0x170),"E2R");
      }
      else {
        pcVar5 = (char *)NaParams::GetParam(*(char **)(in_RDI + 0x98));
        dVar8 = atof(pcVar5);
        *(double *)(in_RDI + 0x170) = dVar8;
      }
    }
  }
  if (pcVar6 != (char *)0x0) {
    NaPrintLog("cstr: state output file parametrs file is \'%s\'\n",pcVar6);
    uVar7 = OpenOutputDataFile(pcVar6,0);
    *(undefined8 *)(in_RDI + 0xa0) = uVar7;
  }
  return;
}

Assistant:

NaCSTRFunc::NaCSTRFunc (char* szOptions, NaVector& vInit)
    : par(NULL), out(NULL)
{
    ini.var.c_A = 0.4915;
    ini.var.c_B = 2.0042;
    ini.var.c_C = 1.7243;
    ini.var.T   = 363.61;
    ini.var.T_c = 350.15;

    if(vInit.dim() == sizeof(ini.state)/sizeof(ini.state[0])) {
	for(int i = 0; i < vInit.dim(); ++i) {
	    ini.state[i] = vInit[i];
	}
    }
    NaPrintLog("cstr: initial state: c_A=%g, c_B=%g, c_C=%g, T=%g, T_c=%g\n",
	       ini.var.c_A, ini.var.c_B, ini.var.c_C, ini.var.T, ini.var.T_c);

    q = 0.015;
    V = 0.23;
    V_c = 0.21;
    rho = 1020;
    rho_c = 998;
    Cp = 4.02;
    Cp_c = 4.182;
    A = 1.51;
    k = 42.8;
    k10 = 1.55e11;
    k20 = 4.55e25;
    drH_1 = -8.6e4;
    drH_2 -1.82e4;
    c_Av = 4.22;
    c_Bv = 0;
    c_Cv = 0;
    T_v = 328;
    T_vc = 298;
    q_sc = 0.004;
    E1R = 9850;
    E2R = 22019;

    char *szBuffer = strdup(szOptions);
    char *szParFile = strtok(szBuffer, " ");
    char *szOutFile = strtok(NULL, " ");
    if(NULL == szParFile) {
	NaPrintLog("cstr: no parameters file is specified; using defaults\n");
    } else {
	try{
	    NaPrintLog("cstr: try to open parameters in file '%s'\n", szParFile);
	    par = new NaParams(szParFile);
	} catch(...) {
	    NaPrintLog("cstr: failed to open parameters file '%s'; using defaults\n", szParFile);
	    par = NULL;
	}
	if(NULL != par) {
#define CHECKPAR(x) if(!par->CheckParam(#x))NaPrintLog("cstr: '%s' is not defined; using default value %g\n",#x,x);
#define SETPAR(x) CHECKPAR(x) else x=atof(par->GetParam(#x))
	    SETPAR(q);
	    SETPAR(V);
	    SETPAR(V_c);
	    SETPAR(rho);
	    SETPAR(rho_c);
	    SETPAR(Cp);
	    SETPAR(Cp_c);
	    SETPAR(A);
	    SETPAR(k);
	    SETPAR(k10);
	    SETPAR(k20);
	    SETPAR(drH_1);
	    SETPAR(drH_2);
	    SETPAR(c_Av);
	    SETPAR(c_Bv);
	    SETPAR(c_Cv);
	    SETPAR(T_v);
	    SETPAR(T_vc);
	    SETPAR(E1R);
	    SETPAR(E2R);
#undef SETPAR
#undef CHECKPAR
	}
    }
    if(NULL != szOutFile) {
	NaPrintLog("cstr: state output file parametrs file is '%s'\n",
		   szOutFile);
	out = OpenOutputDataFile(szOutFile);
    }
}